

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O2

void __thiscall Satyricon::SATSolver::cancel_until(SATSolver *this,int level)

{
  ostream *poVar1;
  
  if (1 < this->log_level) {
    poVar1 = std::operator<<((ostream *)&std::cout,"backtrack from ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(int)((ulong)((long)(this->trail_limit).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->trail_limit).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2));
    poVar1 = std::operator<<(poVar1," to ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,level);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  while (level < (int)((ulong)((long)(this->trail_limit).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->trail_limit).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2)) {
    cancel(this);
  }
  this->propagation_starting_pos =
       (long)(this->trail).
             super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->trail).
             super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  return;
}

Assistant:

void SATSolver::cancel_until( int level ) {
    PRINT_VERBOSE("backtrack from " << current_level() <<
            " to " << level << endl);
    while ( current_level() > level )
        cancel();
    propagation_starting_pos = trail.size();
}